

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O0

bool is_dataset_locked(unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
                       *tasks,string_view dataset_id)

{
  string_view dataset;
  bool bVar1;
  char *in_RDX;
  size_t in_RSI;
  type *task;
  type *k;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
  *__range1;
  unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
  *in_stack_ffffffffffffff28;
  Database *this;
  DatasetLock *in_stack_ffffffffffffff50;
  undefined1 local_98 [152];
  
  local_98._128_8_ = in_RSI;
  local_98._136_8_ = in_RDX;
  local_98._104_8_ =
       std::
       unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
       ::begin(in_stack_ffffffffffffff28);
  local_98._96_8_ =
       std::
       unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
       ::end(in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_unsigned_long,_TaskSpec>,_false> *)
                       (local_98 + 0x68),
                       (_Node_iterator_base<std::pair<const_unsigned_long,_TaskSpec>,_false> *)
                       (local_98 + 0x60));
    if (!bVar1) {
      return false;
    }
    local_98._88_8_ =
         std::__detail::_Node_const_iterator<std::pair<const_unsigned_long,_TaskSpec>,_false,_false>
         ::operator*((_Node_const_iterator<std::pair<const_unsigned_long,_TaskSpec>,_false,_false> *
                     )0x169c84);
    local_98._80_8_ =
         std::get<0ul,unsigned_long_const,TaskSpec>((pair<const_unsigned_long,_TaskSpec> *)0x169c99)
    ;
    local_98._72_8_ =
         std::get<1ul,unsigned_long_const,TaskSpec>((pair<const_unsigned_long,_TaskSpec> *)0x169cae)
    ;
    this = (Database *)local_98;
    dataset._M_str = (char *)local_98._136_8_;
    dataset._M_len = local_98._128_8_;
    DatasetLock::DatasetLock(in_stack_ffffffffffffff50,dataset);
    std::variant<DatasetLock,IteratorLock>::variant<DatasetLock,void,void,DatasetLock,void>
              ((variant<DatasetLock,_IteratorLock> *)this,(DatasetLock *)in_stack_ffffffffffffff28);
    bVar1 = TaskSpec::has_lock(this,(DatabaseLock *)in_stack_ffffffffffffff28);
    std::variant<DatasetLock,_IteratorLock>::~variant
              ((variant<DatasetLock,_IteratorLock> *)0x169d1c);
    DatasetLock::~DatasetLock((DatasetLock *)0x169d26);
    if (bVar1) break;
    std::__detail::_Node_const_iterator<std::pair<const_unsigned_long,_TaskSpec>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_unsigned_long,_TaskSpec>,_false,_false> *)this)
    ;
  }
  return true;
}

Assistant:

bool is_dataset_locked(const std::unordered_map<uint64_t, TaskSpec> &tasks,
                       std::string_view dataset_id) {
    for (const auto &[k, task] : tasks) {
        if (task.has_lock(DatasetLock(dataset_id))) {
            return true;
        }
    }
    return false;
}